

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.h
# Opt level: O0

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::ClearCurMatrix(ParserPOMDPFormat_Spirit *this)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RDI;
  value_type *in_stack_ffffffffffffffa8;
  vector<double,_std::allocator<double>_> *this_00;
  undefined1 local_28 [16];
  pointer local_18;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *)0xa71411);
  local_28 = (undefined1  [16])0x0;
  local_18 = (pointer)0x0;
  this_00 = (vector<double,_std::allocator<double>_> *)local_28;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0xa71433);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(in_RDI,in_stack_ffffffffffffffa8);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  *(undefined1 *)
   &in_RDI[5].
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  return;
}

Assistant:

void ClearCurMatrix()//TODO:move to proper place...
        {
            _m_curMatrix.clear();//no pointers stored, so this should not leak
            _m_curMatrix.push_back( std::vector<double>() );
            _m_matrixModified = false;
        }